

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O0

void mp::
     PLApproximate<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::SinhId>>
               (CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinhId>
                *con,PLApproxParams *laPrm)

{
  PLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinhId>_>
  pla;
  PLApproxParams *p;
  SinhConstraint *in_stack_ffffffffffffff98;
  PLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinhId>_>
  *in_stack_ffffffffffffffa0;
  
  p = (PLApproxParams *)&stack0xffffffffffffffa8;
  PLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinhId>_>
  ::PLApproximator(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,p);
  BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinhId>_>
  ::Run((BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinhId>_>
         *)p);
  PLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinhId>_>
  ::~PLApproximator((PLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinhId>_>
                     *)0x71dfbd);
  return;
}

Assistant:

void PLApproximate(const FuncCon& con,
                             PLApproxParams& laPrm) {
  PLApproximator<FuncCon> pla{con, laPrm};
  pla.Run();
}